

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blocksort.c
# Opt level: O0

void mainQSort3(UInt32 *ptr,UChar *block,UInt16 *quadrant,Int32 nblock,Int32 loSt,Int32 hiSt,
               Int32 dSt,Int32 *budget)

{
  int d_00;
  UInt32 UVar1;
  Int32 IVar2;
  Int32 IVar3;
  byte bVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int local_56c;
  int local_568;
  Int32 tz_2;
  Int32 tz_1;
  Int32 tz;
  Int32 zztmp_4;
  Int32 yyn_1;
  Int32 yyp2_1;
  Int32 yyp1_1;
  Int32 zztmp_3;
  Int32 yyn;
  Int32 yyp2;
  Int32 yyp1;
  Int32 zztmp_2;
  Int32 zztmp_1;
  Int32 zztmp;
  Int32 nextD [3];
  Int32 nextHi [3];
  Int32 nextLo [3];
  Int32 stackD [100];
  Int32 stackHi [100];
  Int32 stackLo [100];
  Int32 d;
  Int32 hi;
  Int32 lo;
  Int32 sp;
  Int32 med;
  Int32 m;
  Int32 n;
  Int32 gtHi;
  Int32 ltLo;
  Int32 unHi;
  Int32 unLo;
  Int32 hiSt_local;
  Int32 loSt_local;
  Int32 nblock_local;
  UInt16 *quadrant_local;
  UChar *block_local;
  UInt32 *ptr_local;
  
  stackHi[0x62] = loSt;
  stackD[0x62] = hiSt;
  nextLo[1] = dSt;
  hi = 1;
  do {
    while( true ) {
      if (hi < 1) {
        return;
      }
      if (0x61 < hi) {
        BZ2_bz__AssertH__fail(0x3e9);
      }
      iVar5 = hi + -1;
      iVar10 = stackHi[(long)iVar5 + 0x62];
      nextD[2] = stackD[(long)iVar5 + 0x62];
      d_00 = nextLo[(long)iVar5 + 1];
      if ((0x13 < nextD[2] - iVar10) && (d_00 < 0xf)) break;
      mainSimpleSort(ptr,block,quadrant,nblock,iVar10,nextD[2],d_00,budget);
      hi = iVar5;
      if (*budget < 0) {
        return;
      }
    }
    bVar4 = mmed3(block[ptr[iVar10] + d_00],block[ptr[nextD[2]] + d_00],
                  block[ptr[iVar10 + nextD[2] >> 1] + d_00]);
    uVar6 = (uint)bVar4;
    n = iVar10;
    ltLo = iVar10;
    gtHi = nextD[2];
    m = nextD[2];
LAB_0073c6b5:
    while (ltLo <= gtHi) {
      if (block[ptr[ltLo] + d_00] == uVar6) {
        UVar1 = ptr[ltLo];
        ptr[ltLo] = ptr[n];
        ptr[n] = UVar1;
        n = n + 1;
        ltLo = ltLo + 1;
      }
      else {
        if (0 < (int)(block[ptr[ltLo] + d_00] - uVar6)) break;
        ltLo = ltLo + 1;
      }
    }
    while (ltLo <= gtHi) {
      if (block[ptr[gtHi] + d_00] == uVar6) {
        UVar1 = ptr[gtHi];
        ptr[gtHi] = ptr[m];
        ptr[m] = UVar1;
        m = m + -1;
        gtHi = gtHi + -1;
      }
      else {
        if ((int)(block[ptr[gtHi] + d_00] - uVar6) < 0) break;
        gtHi = gtHi + -1;
      }
    }
    if (ltLo <= gtHi) {
      UVar1 = ptr[ltLo];
      ptr[ltLo] = ptr[gtHi];
      ptr[gtHi] = UVar1;
      ltLo = ltLo + 1;
      gtHi = gtHi + -1;
      goto LAB_0073c6b5;
    }
    if (m < n) {
      stackHi[(long)iVar5 + 0x62] = iVar10;
      stackD[(long)iVar5 + 0x62] = nextD[2];
      nextLo[(long)iVar5 + 1] = d_00 + 1;
    }
    else {
      if (n - iVar10 < ltLo - n) {
        local_568 = n - iVar10;
      }
      else {
        local_568 = ltLo - n;
      }
      zztmp_3 = ltLo - local_568;
      yyn = iVar10;
      for (yyp1_1 = local_568; 0 < yyp1_1; yyp1_1 = yyp1_1 + -1) {
        UVar1 = ptr[yyn];
        ptr[yyn] = ptr[zztmp_3];
        ptr[zztmp_3] = UVar1;
        yyn = yyn + 1;
        zztmp_3 = zztmp_3 + 1;
      }
      if (nextD[2] - m < m - gtHi) {
        local_56c = nextD[2] - m;
      }
      else {
        local_56c = m - gtHi;
      }
      yyn_1 = ltLo;
      zztmp_4 = nextD[2] - local_56c;
      for (tz = local_56c; zztmp_4 = zztmp_4 + 1, 0 < tz; tz = tz + -1) {
        UVar1 = ptr[yyn_1];
        ptr[yyn_1] = ptr[zztmp_4];
        ptr[zztmp_4] = UVar1;
        yyn_1 = yyn_1 + 1;
      }
      iVar7 = (iVar10 + ltLo) - n;
      iVar8 = iVar7 + -1;
      iVar9 = nextD[2] - (m - gtHi);
      nextHi[2] = iVar9 + 1;
      nextD[1] = iVar8;
      nextHi[1] = iVar10;
      if (iVar8 - iVar10 < nextD[2] - nextHi[2]) {
        nextD[1] = nextD[2];
        nextD[2] = iVar8;
        nextHi[1] = nextHi[2];
        nextHi[2] = iVar10;
      }
      IVar3 = nextHi[1];
      IVar2 = nextD[1];
      zztmp = d_00;
      nextD[0] = d_00 + 1;
      nextHi[0] = iVar9;
      nextLo[0] = iVar7;
      if (nextD[2] - nextHi[2] < iVar9 - iVar7) {
        nextLo[0] = nextHi[2];
        nextHi[0] = nextD[2];
        zztmp = d_00 + 1;
        nextD[0] = d_00;
        nextD[2] = iVar9;
        nextHi[2] = iVar7;
      }
      zztmp_1 = d_00;
      if (nextD[1] - nextHi[1] < nextD[2] - nextHi[2]) {
        nextHi[1] = nextHi[2];
        nextHi[2] = IVar3;
        nextD[1] = nextD[2];
        nextD[2] = IVar2;
        zztmp_1 = zztmp;
        zztmp = d_00;
      }
      stackHi[(long)iVar5 + 0x62] = nextHi[1];
      stackD[(long)iVar5 + 0x62] = nextD[1];
      nextLo[(long)iVar5 + 1] = zztmp_1;
      stackHi[(long)hi + 0x62] = nextHi[2];
      stackD[(long)hi + 0x62] = nextD[2];
      nextLo[(long)hi + 1] = zztmp;
      iVar10 = hi + 1;
      stackHi[(long)iVar10 + 0x62] = nextLo[0];
      stackD[(long)iVar10 + 0x62] = nextHi[0];
      nextLo[(long)iVar10 + 1] = nextD[0];
      hi = hi + 2;
    }
  } while( true );
}

Assistant:

static
void mainQSort3 ( UInt32* ptr,
                  UChar*  block,
                  UInt16* quadrant,
                  Int32   nblock,
                  Int32   loSt, 
                  Int32   hiSt, 
                  Int32   dSt,
                  Int32*  budget )
{
   Int32 unLo, unHi, ltLo, gtHi, n, m, med;
   Int32 sp, lo, hi, d;

   Int32 stackLo[MAIN_QSORT_STACK_SIZE];
   Int32 stackHi[MAIN_QSORT_STACK_SIZE];
   Int32 stackD [MAIN_QSORT_STACK_SIZE];

   Int32 nextLo[3];
   Int32 nextHi[3];
   Int32 nextD [3];

   sp = 0;
   mpush ( loSt, hiSt, dSt );

   while (sp > 0) {

      AssertH ( sp < MAIN_QSORT_STACK_SIZE - 2, 1001 );

      mpop ( lo, hi, d );
      if (hi - lo < MAIN_QSORT_SMALL_THRESH || 
          d > MAIN_QSORT_DEPTH_THRESH) {
         mainSimpleSort ( ptr, block, quadrant, nblock, lo, hi, d, budget );
         if (*budget < 0) return;
         continue;
      }

      med = (Int32) 
            mmed3 ( block[ptr[ lo         ]+d],
                    block[ptr[ hi         ]+d],
                    block[ptr[ (lo+hi)>>1 ]+d] );

      unLo = ltLo = lo;
      unHi = gtHi = hi;

      while (True) {
         while (True) {
            if (unLo > unHi) break;
            n = ((Int32)block[ptr[unLo]+d]) - med;
            if (n == 0) { 
               mswap(ptr[unLo], ptr[ltLo]); 
               ltLo++; unLo++; continue; 
            };
            if (n >  0) break;
            unLo++;
         }
         while (True) {
            if (unLo > unHi) break;
            n = ((Int32)block[ptr[unHi]+d]) - med;
            if (n == 0) { 
               mswap(ptr[unHi], ptr[gtHi]); 
               gtHi--; unHi--; continue; 
            };
            if (n <  0) break;
            unHi--;
         }
         if (unLo > unHi) break;
         mswap(ptr[unLo], ptr[unHi]); unLo++; unHi--;
      }

      AssertD ( unHi == unLo-1, "mainQSort3(2)" );

      if (gtHi < ltLo) {
         mpush(lo, hi, d+1 );
         continue;
      }

      n = mmin(ltLo-lo, unLo-ltLo); mvswap(lo, unLo-n, n);
      m = mmin(hi-gtHi, gtHi-unHi); mvswap(unLo, hi-m+1, m);

      n = lo + unLo - ltLo - 1;
      m = hi - (gtHi - unHi) + 1;

      nextLo[0] = lo;  nextHi[0] = n;   nextD[0] = d;
      nextLo[1] = m;   nextHi[1] = hi;  nextD[1] = d;
      nextLo[2] = n+1; nextHi[2] = m-1; nextD[2] = d+1;

      if (mnextsize(0) < mnextsize(1)) mnextswap(0,1);
      if (mnextsize(1) < mnextsize(2)) mnextswap(1,2);
      if (mnextsize(0) < mnextsize(1)) mnextswap(0,1);

      AssertD (mnextsize(0) >= mnextsize(1), "mainQSort3(8)" );
      AssertD (mnextsize(1) >= mnextsize(2), "mainQSort3(9)" );

      mpush (nextLo[0], nextHi[0], nextD[0]);
      mpush (nextLo[1], nextHi[1], nextD[1]);
      mpush (nextLo[2], nextHi[2], nextD[2]);
   }
}